

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLFormatter::XMLFormatter
          (XMLFormatter *this,XMLCh *outEncoding,XMLCh *docVersion,XMLFormatTarget *target,
          EscapeFlags escapeFlags,UnRepFlags unrepFlags,MemoryManager *manager)

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  int iVar4;
  XMLTranscoder *pXVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  TranscodingException *this_00;
  size_t __n;
  bool bVar7;
  Codes resCode;
  Codes local_2c;
  
  this->fEscapeFlags = escapeFlags;
  this->fOutEncoding = (XMLCh *)0x0;
  this->fTarget = target;
  this->fUnRepFlags = unrepFlags;
  this->fXCoder = (XMLTranscoder *)0x0;
  this->fAposRef = (XMLByte *)0x0;
  this->fAposLen = 0;
  this->fAmpRef = (XMLByte *)0x0;
  this->fAmpLen = 0;
  this->fGTRef = (XMLByte *)0x0;
  this->fGTLen = 0;
  this->fLTRef = (XMLByte *)0x0;
  this->fLTLen = 0;
  this->fQuoteRef = (XMLByte *)0x0;
  this->fQuoteLen = 0;
  this->fIsXML11 = false;
  this->fMemoryManager = manager;
  pXVar5 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,outEncoding,&local_2c,0x4000,manager);
  this->fXCoder = pXVar5;
  if (pXVar5 == (XMLTranscoder *)0x0) {
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLFormatter.cpp"
               ,0xee,Trans_CantCreateCvtrFor,outEncoding,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
  }
  if (outEncoding == (XMLCh *)0x0) {
    pXVar6 = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)outEncoding + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    pXVar6 = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memcpy(pXVar6,outEncoding,__n);
  }
  this->fOutEncoding = pXVar6;
  if (docVersion == L"1.1") {
    bVar7 = true;
  }
  else {
    pXVar6 = L"1.1";
    if (docVersion == (XMLCh *)0x0) {
LAB_0029a2bc:
      bVar7 = *pXVar6 == L'\0';
    }
    else {
      do {
        XVar2 = *docVersion;
        if (XVar2 == L'\0') goto LAB_0029a2bc;
        docVersion = docVersion + 1;
        XVar3 = *pXVar6;
        pXVar6 = pXVar6 + 1;
      } while (XVar2 == XVar3);
      bVar7 = false;
    }
  }
  this->fIsXML11 = bVar7;
  return;
}

Assistant:

XMLFormatter::XMLFormatter( const   XMLCh* const            outEncoding
                            , const XMLCh* const            docVersion
                            ,       XMLFormatTarget* const  target
                            , const EscapeFlags             escapeFlags
                            , const UnRepFlags              unrepFlags
                            ,       MemoryManager* const    manager)
    : fEscapeFlags(escapeFlags)
    , fOutEncoding(0)
    , fTarget(target)
    , fUnRepFlags(unrepFlags)
    , fXCoder(0)
    , fAposRef(0)
    , fAposLen(0)
    , fAmpRef(0)
    , fAmpLen(0)
    , fGTRef(0)
    , fGTLen(0)
    , fLTRef(0)
    , fLTLen(0)
    , fQuoteRef(0)
    , fQuoteLen(0)
    , fIsXML11(false)
    , fMemoryManager(manager)
{
    // Try to create a transcoder for this encoding
    XMLTransService::Codes resCode;
    fXCoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        outEncoding
        , resCode
        , kTmpBufSize
        , fMemoryManager
    );

    if (!fXCoder)
    {
        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , outEncoding
            , fMemoryManager
        );
    }

    // Copy the encoding string
    fOutEncoding = XMLString::replicate(outEncoding, fMemoryManager);

    fIsXML11 = XMLString::equals(docVersion, XMLUni::fgVersion1_1);
}